

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O0

void __thiscall EchoServer::printThroughput(EchoServer *this)

{
  long lVar1;
  Timestamp high;
  __int_type _Var2;
  long lVar3;
  double dVar4;
  double time;
  int64_t msgs;
  int64_t bytes;
  int64_t newCounter;
  Timestamp endTime;
  EchoServer *this_local;
  
  high = sznet::Timestamp::now();
  _Var2 = std::__atomic_base::operator_cast_to_long((__atomic_base *)&this->m_transferred);
  lVar3 = _Var2 - this->m_oldCounter;
  LOCK();
  lVar1 = (this->m_receivedMessages).super___atomic_base<long>._M_i;
  (this->m_receivedMessages).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  dVar4 = sznet::timeDifference(high,(Timestamp)(this->m_startTime).m_microSecondsSinceEpoch);
  printf("%4.3f MiB/s %4.3f Ki Msgs/s %6.2f bytes per msg\n",
         (((double)lVar3 / dVar4) / 1024.0) / 1024.0,((double)lVar1 / dVar4) / 1024.0,
         (double)lVar3 / (double)lVar1);
  this->m_oldCounter = _Var2;
  (this->m_startTime).m_microSecondsSinceEpoch = high.m_microSecondsSinceEpoch;
  return;
}

Assistant:

void printThroughput()
    {
        Timestamp endTime = Timestamp::now();
        int64_t newCounter = m_transferred;
        int64_t bytes = newCounter - m_oldCounter;
        int64_t msgs = m_receivedMessages.exchange(0);
        double time = timeDifference(endTime, m_startTime);
        printf("%4.3f MiB/s %4.3f Ki Msgs/s %6.2f bytes per msg\n",
            static_cast<double>(bytes) / time / 1024 / 1024,
            static_cast<double>(msgs) / time / 1024,
            static_cast<double>(bytes) / static_cast<double>(msgs));

        m_oldCounter = newCounter;
        m_startTime = endTime;
    }